

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_BasicRepeatedTest_Test::
ComparisonTest_BasicRepeatedTest_Test(ComparisonTest_BasicRepeatedTest_Test *this)

{
  ComparisonTest_BasicRepeatedTest_Test *this_local;
  
  ComparisonTest::ComparisonTest(&this->super_ComparisonTest);
  (this->super_ComparisonTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ComparisonTest_BasicRepeatedTest_Test_02a263e0;
  return;
}

Assistant:

TEST_F(ComparisonTest, BasicRepeatedTest) {
  proto1_.clear_repeated_int32();
  proto2_.clear_repeated_int32();

  proto1_.add_repeated_int32(500);
  proto1_.add_repeated_int32(501);
  proto1_.add_repeated_int32(502);
  proto1_.add_repeated_int32(503);
  proto1_.add_repeated_int32(500);

  proto2_.add_repeated_int32(500);
  proto2_.add_repeated_int32(509);
  proto2_.add_repeated_int32(502);
  proto2_.add_repeated_int32(504);

  EXPECT_EQ(
      "modified: repeated_int32[1]: 501 -> 509\n"
      "modified: repeated_int32[3]: 503 -> 504\n"
      "deleted: repeated_int32[4]: 500\n",
      Run());
}